

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmInstallTargetGenerator::GetDestDirPath
          (string *__return_storage_ptr__,cmInstallTargetGenerator *this,string *file)

{
  char cVar1;
  allocator local_11;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"$ENV{DESTDIR}",&local_11);
  cVar1 = *(file->_M_dataplus)._M_p;
  if ((cVar1 != '$') && (cVar1 != '/')) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallTargetGenerator::GetDestDirPath(std::string const& file)
{
  // Construct the path of the file on disk after installation on
  // which tweaks may be performed.
  std::string toDestDirPath = "$ENV{DESTDIR}";
  if(file[0] != '/' && file[0] != '$')
    {
    toDestDirPath += "/";
    }
  toDestDirPath += file;
  return toDestDirPath;
}